

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O0

void __thiscall
OpenMesh::BaseKernel::add_property<OpenMesh::Attributes::StatusInfo>
          (BaseKernel *this,HPropHandleT<OpenMesh::Attributes::StatusInfo> *_ph,string *_name)

{
  int iVar1;
  undefined4 extraout_var;
  StatusInfo local_2c;
  BaseHandle local_28;
  HPropHandleT<OpenMesh::Attributes::StatusInfo> local_24;
  string *local_20;
  string *_name_local;
  HPropHandleT<OpenMesh::Attributes::StatusInfo> *_ph_local;
  BaseKernel *this_local;
  
  local_20 = _name;
  _name_local = (string *)_ph;
  _ph_local = (HPropHandleT<OpenMesh::Attributes::StatusInfo> *)this;
  Attributes::StatusInfo::StatusInfo(&local_2c);
  local_28.idx_ =
       (int)PropertyContainer::add<OpenMesh::Attributes::StatusInfo>
                      (&this->hprops_,&local_2c,local_20);
  HPropHandleT<OpenMesh::Attributes::StatusInfo>::HPropHandleT
            (&local_24,(BasePropHandleT<OpenMesh::Attributes::StatusInfo> *)&local_28);
  *(BasePropHandleT<OpenMesh::Attributes::StatusInfo> *)_name_local =
       local_24.super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_;
  iVar1 = (*this->_vptr_BaseKernel[3])();
  PropertyContainer::resize(&this->hprops_,CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void add_property( HPropHandleT<T>& _ph, const std::string& _name="<hprop>")
  {
    _ph = HPropHandleT<T>( hprops_.add(T(), _name) );
    hprops_.resize(n_halfedges());
  }